

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O0

void __thiscall sznet::net::TcpConnection::handleClose(TcpConnection *this)

{
  LogLevel LVar1;
  sz_fd v;
  LogStream *pLVar2;
  self *psVar3;
  pointer pCVar4;
  char *str;
  bool bVar5;
  SourceFile file;
  undefined1 local_1010 [8];
  TcpConnectionPtr guardThis;
  undefined1 local_ff0 [12];
  Logger local_fe0;
  TcpConnection *local_10;
  TcpConnection *this_local;
  
  local_10 = this;
  EventLoop::assertInLoopThread(this->m_loop);
  LVar1 = Logger::logLevel();
  if ((int)LVar1 < 1) {
    Logger::SourceFile::SourceFile<104>
              ((SourceFile *)local_ff0,
               (char (*) [104])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpConnection.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_ff0._0_8_;
    file.m_size = local_ff0._8_4_;
    Logger::Logger(&local_fe0,file,0x197,TRACE,"handleClose");
    pLVar2 = Logger::stream(&local_fe0);
    psVar3 = LogStream::operator<<(pLVar2,"fd = ");
    pCVar4 = std::unique_ptr<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>::
             operator->(&this->m_channel);
    v = Channel::fd(pCVar4);
    pLVar2 = LogStream::operator<<(psVar3,v);
    psVar3 = LogStream::operator<<(pLVar2," state = ");
    str = stateToString(this);
    LogStream::operator<<(psVar3,str);
    Logger::~Logger(&local_fe0);
  }
  bVar5 = true;
  if (this->m_state != kConnected) {
    bVar5 = this->m_state == kDisconnecting;
  }
  if (bVar5) {
    setState(this,kDisconnected);
    pCVar4 = std::unique_ptr<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>::
             operator->(&this->m_channel);
    Channel::disableAll(pCVar4);
    std::enable_shared_from_this<sznet::net::TcpConnection>::shared_from_this
              ((enable_shared_from_this<sznet::net::TcpConnection> *)local_1010);
    bVar5 = std::function::operator_cast_to_bool((function *)&this->m_connectionCallback);
    if (bVar5) {
      std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>::operator()
                (&this->m_connectionCallback,(shared_ptr<sznet::net::TcpConnection> *)local_1010);
    }
    std::function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&)>::operator()
              (&this->m_closeCallback,(shared_ptr<sznet::net::TcpConnection> *)local_1010);
    std::shared_ptr<sznet::net::TcpConnection>::~shared_ptr
              ((shared_ptr<sznet::net::TcpConnection> *)local_1010);
    return;
  }
  __assert_fail("m_state == kConnected || m_state == kDisconnecting",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpConnection.cpp"
                ,0x198,"void sznet::net::TcpConnection::handleClose()");
}

Assistant:

void TcpConnection::handleClose()
{
	m_loop->assertInLoopThread();
	LOG_TRACE << "fd = " << m_channel->fd() << " state = " << stateToString();
	assert(m_state == kConnected || m_state == kDisconnecting);
	// we don't close fd, leave it to dtor, so we can find leaks easily.
	setState(kDisconnected);
	m_channel->disableAll();

	// ��ֹ��ǰ�ͷţ����ɲ���Ԥ��������
	TcpConnectionPtr guardThis(shared_from_this());
	if (m_connectionCallback)
	{
		m_connectionCallback(guardThis);
	}
	// must be the last line
	m_closeCallback(guardThis);
}